

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O2

void __thiscall
cmsys::CommandLineArguments::PopulateVariable
          (CommandLineArguments *this,double *variable,string *value)

{
  double dVar1;
  char *res;
  char *local_10;
  
  local_10 = (char *)0x0;
  dVar1 = strtod((value->_M_dataplus)._M_p,&local_10);
  *variable = dVar1;
  return;
}

Assistant:

void CommandLineArguments::PopulateVariable(
  double* variable, const std::string& value)
{
  char* res = 0;
  *variable = strtod(value.c_str(), &res);
  //if ( res && *res )
  //  {
  //  Can handle non-double
  //  }
}